

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_utils.h
# Opt level: O0

void transpose_TX_16X16(uint8_t *src,ptrdiff_t pitchSrc,uint8_t *dst,ptrdiff_t pitchDst)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int j_1;
  int j;
  __m128i d [16];
  __m128i r [16];
  int local_250;
  int local_24c;
  undefined8 local_248 [13];
  __m128i *in_stack_fffffffffffffe20;
  __m128i *in_stack_fffffffffffffe28;
  long local_40;
  long local_38;
  undefined8 *local_20;
  
  for (local_24c = 0; local_24c < 0x10; local_24c = local_24c + 1) {
    local_20 = (undefined8 *)(in_RDI + local_24c * in_RSI);
    uVar1 = local_20[1];
    *(undefined8 *)(&stack0xfffffffffffffeb8 + (long)local_24c * 0x10) = *local_20;
    *(undefined8 *)(&stack0xfffffffffffffec0 + (long)local_24c * 0x10) = uVar1;
  }
  local_40 = in_RCX;
  local_38 = in_RDX;
  transpose16x16_sse2(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  for (local_250 = 0; local_250 < 0x10; local_250 = local_250 + 1) {
    puVar2 = (undefined8 *)(local_38 + local_250 * local_40);
    uVar1 = local_248[(long)local_250 * 2 + 1];
    *puVar2 = local_248[(long)local_250 * 2];
    puVar2[1] = uVar1;
  }
  return;
}

Assistant:

static void transpose_TX_16X16(const uint8_t *src, ptrdiff_t pitchSrc,
                               uint8_t *dst, ptrdiff_t pitchDst) {
  __m128i r[16];
  __m128i d[16];
  for (int j = 0; j < 16; j++) {
    r[j] = _mm_loadu_si128((__m128i *)(src + j * pitchSrc));
  }
  transpose16x16_sse2(r, d);
  for (int j = 0; j < 16; j++) {
    _mm_storeu_si128((__m128i *)(dst + j * pitchDst), d[j]);
  }
}